

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O2

bool Js::DynamicProfileInfo::IsEnabled_OptionalFunctionBody
               (FunctionBody *functionBody,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  LocalFunctionId LVar4;
  undefined4 *puVar5;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0xf4,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  if (functionBody == (FunctionBody *)0x0) {
    bVar2 = Phases::IsEnabledForAll((Phases *)&DAT_01441eb0,DynamicProfilePhase);
    if (bVar2) {
      return false;
    }
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01436260,DynamicProfilePhase);
    if (bVar2) {
      return true;
    }
    if ((scriptContext->config).NoNative == false) {
      return true;
    }
  }
  else {
    uVar3 = FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
    LVar4 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01441eb0,DynamicProfilePhase,uVar3,LVar4);
    if (bVar2) {
      return false;
    }
    uVar3 = FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
    LVar4 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01436260,DynamicProfilePhase,uVar3,LVar4);
    if (bVar2) {
      return true;
    }
    if ((scriptContext->config).NoNative != true) {
      return true;
    }
    bVar2 = FunctionProxy::IsInDebugMode((FunctionProxy *)functionBody);
    if (bVar2) {
      return true;
    }
  }
  return DynamicProfileStorage::collectInfo;
}

Assistant:

bool DynamicProfileInfo::IsEnabled_OptionalFunctionBody(const FunctionBody *const functionBody, const ScriptContext *const scriptContext)
    {
        Assert(scriptContext);

        return
            !PHASE_OFF_OPTFUNC(DynamicProfilePhase, functionBody) &&
            (
#if ENABLE_DEBUG_CONFIG_OPTIONS
                PHASE_FORCE_OPTFUNC(DynamicProfilePhase, functionBody) ||
#else
                Js::Configuration::Global.flags.ForceDynamicProfile ||
#endif
                !scriptContext->GetConfig()->IsNoNative() ||
                (functionBody && functionBody->IsInDebugMode())
#ifdef DYNAMIC_PROFILE_STORAGE
                || DynamicProfileStorage::DoCollectInfo()
#endif
                );
    }